

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

Node * __thiscall czh::parser::Parser::parse(Node *__return_storage_ptr__,Parser *this)

{
  Token *this_00;
  pointer pcVar1;
  TokenType TVar2;
  undefined8 extraout_RAX;
  Lexer *this_01;
  source_location local_88;
  undefined1 local_80 [72];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->curr_node == (Node *)0x0) {
    parse();
  }
  lexer::Lexer::get((Token *)local_80,this->lex);
  this_00 = &this->curr_tok;
  token::Token::operator=(this_00,(Token *)local_80);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)(local_80 + 8));
  TVar2 = this_00->type;
  pcVar1 = local_80 + 0x10;
  local_80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Unexpected end of czh.","");
  local_88._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f318;
  czh::error::czh_assert(TVar2 != FEND,(string *)local_80,&local_88);
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  this_01 = this->lex;
  if (this_01->is_eof == false) {
    do {
      TVar2 = this_00->type;
      if ((int)TVar2 < 9) {
        if (TVar2 != ID) {
          if (TVar2 != FEND) {
LAB_0011a07c:
            local_80._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_80,"Unexpected token","");
            local_88._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019f330;
            czh::error::czh_unreachable((string *)local_80,&local_88);
            if ((pointer)local_80._0_8_ != pcVar1) {
              operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
            }
            _Unwind_Resume(extraout_RAX);
          }
          break;
        }
        parse_id(this);
      }
      else if (TVar2 == SEND) {
        lexer::Lexer::get((Token *)local_80,this_01);
        token::Token::operator=(this_00,(Token *)local_80);
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        std::__detail::__variant::
        _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)(local_80 + 8));
      }
      else {
        if (TVar2 != SCEND) goto LAB_0011a07c;
        parse_end(this);
      }
      this_01 = this->lex;
    } while (this_01->is_eof != true);
  }
  this->curr_node = (Node *)0x0;
  node::Node::Node(__return_storage_ptr__,&this->node);
  return __return_storage_ptr__;
}

Assistant:

node::Node parse()
    {
      if (curr_node == nullptr)
      {
        node.reset();
        curr_node = &node;
        lex->reset();
      }
      curr_tok = get();
      error::czh_assert(curr_tok.type != token::TokenType::FEND, "Unexpected end of czh.");
      while (check())
      {
        switch (curr_tok.type)
        {
          case token::TokenType::ID:
            parse_id();
            break;
          case token::TokenType::SCEND:
            parse_end();
            break;
          case token::TokenType::SEND:
            curr_tok = get();
            break;
          case token::TokenType::FEND:
            curr_node = nullptr;
            return std::move(node);
          default:
            error::czh_unreachable("Unexpected token");
            break;
        }
      }
      curr_node = nullptr;
      return std::move(node);
    }